

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

int isCarbonylAtom(atom *a)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__needle;
  
  __needle = a->r->resname;
  pcVar3 = strstr(":GLY:ALA:VAL:PHE:PRO:MET:ILE:LEU:ASP:GLU:LYS:ARG:SER:THR:TYR:HIS:CYS:ASN:GLN:TRP:ASX:GLX:ACE:FOR:NH2:NME:MSE:AIB:ABU:PCA:"
                  ,__needle);
  if ((pcVar3 != (char *)0x0) && (iVar1 = strcmp(a->atomname," C  "), iVar1 == 0)) {
    return 1;
  }
  pcVar3 = strstr(":ASP:ASN:ASX:",__needle);
  if ((pcVar3 != (char *)0x0) && (pcVar3 = strstr(": CG :",a->atomname), pcVar3 != (char *)0x0)) {
    return 1;
  }
  pcVar3 = strstr(":GLU:GLN:GLX:",__needle);
  if (pcVar3 == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    pcVar3 = strstr(": CD :",a->atomname);
    uVar2 = (uint)(pcVar3 != (char *)0x0);
  }
  return uVar2;
}

Assistant:

int isCarbonylAtom(atom *a) { /* limitation: this will not handle het groups properly */
   return (strstr(AAList, a->r->resname) && (!strcmp(a->atomname,  " C  ")))
   ||((strstr(":ASP:ASN:ASX:",a->r->resname))&&(strstr(": CG :",a->atomname)))
   ||((strstr(":GLU:GLN:GLX:",a->r->resname))&&(strstr(": CD :",a->atomname)));
}